

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

TValue * luaH_newkey(lua_State *L,Table *t,TValue *key)

{
  int iVar1;
  Node *pNVar2;
  TValue *pTVar3;
  TValue *io_;
  TKey *k_;
  Node *f;
  Node *othern;
  TValue *io;
  lua_Integer k;
  TValue aux;
  Node *mp;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  if (key->tt_ == 0) {
    luaG_runerror(L,"table index is nil");
  }
  mp = (Node *)key;
  if (key->tt_ == 3) {
    iVar1 = luaV_tointeger(key,(lua_Integer *)&io,0);
    if (iVar1 == 0) {
      if (((key->value_).n != (key->value_).n) || (NAN((key->value_).n) || NAN((key->value_).n))) {
        luaG_runerror(L,"table index is NaN");
      }
    }
    else {
      k = (lua_Integer)io;
      aux.value_.b = 0x13;
      mp = (Node *)&k;
    }
  }
  aux._8_8_ = mainposition(t,&mp->i_val);
  if (((((Node *)aux._8_8_)->i_val).tt_ != 0) || (t->lastfree == (Node *)0x0)) {
    pNVar2 = getfreepos(t);
    if (pNVar2 == (Node *)0x0) {
      rehash(L,t,&mp->i_val);
      pTVar3 = luaH_set(L,t,&mp->i_val);
      return pTVar3;
    }
    f = mainposition(t,(TValue *)(aux._8_8_ + 0x10));
    if (f == (Node *)aux._8_8_) {
      if (*(int *)(aux._8_8_ + 0x1c) != 0) {
        (pNVar2->i_key).nk.next =
             (int)((aux._8_8_ + (long)*(int *)(aux._8_8_ + 0x1c) * 0x20) - (long)pNVar2 >> 5);
      }
      *(int *)(aux._8_8_ + 0x1c) = (int)((long)pNVar2 - aux._8_8_ >> 5);
      aux._8_8_ = pNVar2;
    }
    else {
      for (; f + (f->i_key).nk.next != (Node *)aux._8_8_; f = f + (f->i_key).nk.next) {
      }
      (f->i_key).nk.next = (int)((long)pNVar2 - (long)f >> 5);
      (pNVar2->i_val).value_ = *(Value *)aux._8_8_;
      *(undefined8 *)&(pNVar2->i_val).tt_ = *(undefined8 *)(aux._8_8_ + 8);
      (pNVar2->i_key).nk.value_ = *(Value *)(aux._8_8_ + 0x10);
      *(undefined8 *)((long)&pNVar2->i_key + 8) = *(undefined8 *)(aux._8_8_ + 0x18);
      if (*(int *)(aux._8_8_ + 0x1c) != 0) {
        (pNVar2->i_key).nk.next = (int)(aux._8_8_ - (long)pNVar2 >> 5) + (pNVar2->i_key).nk.next;
        *(undefined4 *)(aux._8_8_ + 0x1c) = 0;
      }
      *(undefined4 *)(aux._8_8_ + 8) = 0;
    }
  }
  *(Value *)(aux._8_8_ + 0x10) = (mp->i_val).value_;
  *(int *)(aux._8_8_ + 0x18) = (mp->i_val).tt_;
  if (((((mp->i_val).tt_ & 0x40U) != 0) && ((t->marked & 4) != 0)) &&
     ((((mp->i_val).value_.gc)->marked & 3) != 0)) {
    luaC_barrierback_(L,t);
  }
  return (TValue *)aux._8_8_;
}

Assistant:

TValue *luaH_newkey(lua_State *L, Table *t, const TValue *key) {
    Node *mp;
    TValue aux;
    if (ttisnil(key)) luaG_runerror(L, "table index is nil");
    else if (ttisfloat(key)) {
        lua_Integer k;
        if (luaV_tointeger(key, &k, 0)) {  /* does index fit in an integer? */
            setivalue(&aux, k);
            key = &aux;  /* insert it as an integer */
        } else if (luai_numisnan(fltvalue(key)))
            luaG_runerror(L, "table index is NaN");
    }
    mp = mainposition(t, key);
    if (!ttisnil(gval(mp)) || isdummy(t)) {  /* main position is taken? */
        Node *othern;
        Node *f = getfreepos(t);  /* get a free place */
        if (f == NULL) {  /* cannot find a free place? */
            rehash(L, t, key);  /* grow table */
            /* whatever called 'newkey' takes care of TM cache */
            return luaH_set(L, t, key);  /* insert key into grown table */
        }
        lua_assert(!isdummy(t));
        othern = mainposition(t, gkey(mp));
        if (othern != mp) {  /* is colliding node out of its main position? */
            /* yes; move colliding node into free position */
            while (othern + gnext(othern) != mp)  /* find previous */
                othern += gnext(othern);
            gnext(othern) = cast_int(f - othern);  /* rechain to point to 'f' */
            *f = *mp;  /* copy colliding node into free pos. (mp->next also goes) */
            if (gnext(mp) != 0) {
                gnext(f) += cast_int(mp - f);  /* correct 'next' */
                gnext(mp) = 0;  /* now 'mp' is free */
            }
            setnilvalue(gval(mp));
        } else {  /* colliding node is in its own main position */
            /* new node will go into free position */
            if (gnext(mp) != 0)
                gnext(f) = cast_int((mp + gnext(mp)) - f);  /* chain new position */
            else
                lua_assert(gnext(f) == 0);
            gnext(mp) = cast_int(f - mp);
            mp = f;
        }
    }
    setnodekey(L, &mp->i_key, key);
    luaC_barrierback(L, t, key);
    lua_assert(ttisnil(gval(mp)));
    return gval(mp);
}